

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteHeader(BinaryWriter *this,char *name,int index)

{
  Stream *this_00;
  
  if (this->stream_->log_stream_ == (Stream *)0x0) {
    return;
  }
  this_00 = Stream::log_stream(this->stream_);
  if (index != -1) {
    Stream::Writef(this_00,"; %s %d\n",name,(ulong)(uint)index);
    return;
  }
  Stream::Writef(this_00,"; %s\n",name);
  return;
}

Assistant:

void BinaryWriter::WriteHeader(const char* name, int index) {
  if (stream_->has_log_stream()) {
    if (index == PRINT_HEADER_NO_INDEX) {
      stream_->log_stream().Writef("; %s\n", name);
    } else {
      stream_->log_stream().Writef("; %s %d\n", name, index);
    }
  }
}